

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

data_ptr * cpptempl::make_data(data_ptr *__return_storage_ptr__,string *val)

{
  DataValue *this;
  string local_40;
  
  this = (DataValue *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_40,(string *)val);
  DataValue::DataValue(this,&local_40);
  data_ptr::data_ptr(__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline data_ptr make_data(std::string val)
    {
        return data_ptr(new DataValue(val)) ;
    }